

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSatG.c
# Opt level: O1

void Cec3_CollectSuper_rec(Gia_Obj_t *pObj,Vec_Ptr_t *vSuper,int fFirst,int fUseMuxes)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  void **ppvVar4;
  long lVar5;
  int iVar6;
  
  for (; (((((ulong)pObj & 1) == 0 && (uVar3 = *(ulong *)pObj, (~(uint)uVar3 & 0x9fffffff) != 0)) &&
          ((fFirst != 0 || ((int)pObj->Value < 2)))) &&
         ((fUseMuxes == 0 || ((uVar3 & 0x40000000) == 0))));
      pObj = (Gia_Obj_t *)
             ((ulong)((uint)(*(ulong *)pObj >> 0x3d) & 1) |
             (ulong)(pObj + -(*(ulong *)pObj >> 0x20 & 0x1fffffff)))) {
    fFirst = 0;
    Cec3_CollectSuper_rec
              ((Gia_Obj_t *)
               ((ulong)((uint)(uVar3 >> 0x1d) & 1) | (ulong)(pObj + -(uVar3 & 0x1fffffff))),vSuper,0
               ,fUseMuxes);
  }
  uVar1 = vSuper->nSize;
  if (0 < (long)(int)uVar1) {
    lVar5 = 0;
    do {
      if ((Gia_Obj_t *)vSuper->pArray[lVar5] == pObj) {
        return;
      }
      lVar5 = lVar5 + 1;
    } while ((int)uVar1 != lVar5);
  }
  uVar2 = vSuper->nCap;
  if (uVar1 == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (vSuper->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(vSuper->pArray,0x80);
      }
      vSuper->pArray = ppvVar4;
      iVar6 = 0x10;
    }
    else {
      iVar6 = uVar2 * 2;
      if (iVar6 <= (int)uVar2) goto LAB_00649e2a;
      if (vSuper->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar4 = (void **)realloc(vSuper->pArray,(ulong)uVar2 << 4);
      }
      vSuper->pArray = ppvVar4;
    }
    vSuper->nCap = iVar6;
  }
LAB_00649e2a:
  iVar6 = vSuper->nSize;
  vSuper->nSize = iVar6 + 1;
  vSuper->pArray[iVar6] = pObj;
  return;
}

Assistant:

void Cec3_CollectSuper_rec( Gia_Obj_t * pObj, Vec_Ptr_t * vSuper, int fFirst, int fUseMuxes )
{
    // if the new node is complemented or a PI, another gate begins
    if ( Gia_IsComplement(pObj) || Gia_ObjIsCi(pObj) || 
         (!fFirst && Gia_ObjValue(pObj) > 1) || 
         (fUseMuxes && pObj->fMark0) )
    {
        Vec_PtrPushUnique( vSuper, pObj );
        return;
    }
    // go through the branches
    Cec3_CollectSuper_rec( Gia_ObjChild0(pObj), vSuper, 0, fUseMuxes );
    Cec3_CollectSuper_rec( Gia_ObjChild1(pObj), vSuper, 0, fUseMuxes );
}